

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O1

uint objgetap0(mcmcxdef *ctx,objnum obj,prpnum prop,objnum *orn,int inh,dattyp *ortyp)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  bool bVar5;
  uint unaff_EBP;
  long lVar6;
  objnum parentnum;
  objnum o1n;
  dattyp typ;
  int isdesc;
  uchar sclist [100];
  mcmon local_c2;
  dattyp local_c0;
  dattyp local_bc;
  uint local_b8;
  int local_b4;
  objnum *local_b0;
  dattyp *local_a8;
  ulong local_a0;
  objnum local_98 [52];
  
  if ((inh == 0) && (uVar3 = objgetp(ctx,obj,prop,&local_bc), uVar3 != 0)) {
    if (orn != (objnum *)0x0) {
      *orn = obj;
    }
    local_c0 = local_bc;
    if (ortyp == (dattyp *)0x0) {
      return uVar3;
    }
  }
  else {
    puVar4 = mcmlck(ctx,obj);
    uVar1 = *(ushort *)(puVar4 + 4);
    memcpy(local_98,puVar4 + 0xe,(ulong)((uint)uVar1 * 2));
    mcmunlck(ctx,obj);
    if (uVar1 == 0) {
      uVar3 = 0;
      parentnum = 0xffff;
      local_c0 = 5;
    }
    else {
      local_c0 = 5;
      parentnum = 0xffff;
      lVar6 = 0;
      local_b8 = (uint)prop;
      bVar5 = false;
      local_b0 = orn;
      local_a8 = ortyp;
      local_a0 = (ulong)uVar1;
      do {
        uVar2 = objgetap0(ctx,local_98[lVar6],(prpnum)local_b8,&local_c2,0,&local_bc);
        if ((short)uVar2 != 0) {
          if (bVar5) {
            puVar4 = mcmlck(ctx,local_c2);
            local_b4 = objisd(ctx,puVar4,parentnum);
            mcmunlck(ctx,local_c2);
          }
          if (local_b4 != 0 || !bVar5) {
            unaff_EBP = uVar2;
            local_c0 = local_bc;
            parentnum = local_c2;
          }
          bVar5 = true;
        }
        lVar6 = lVar6 + 1;
      } while ((short)local_a0 != (short)lVar6);
      uVar3 = unaff_EBP & 0xffff;
      orn = local_b0;
      ortyp = local_a8;
      if (!bVar5) {
        uVar3 = 0;
      }
    }
    if (orn != (objnum *)0x0) {
      *orn = parentnum;
    }
    if (ortyp == (dattyp *)0x0) {
      return uVar3;
    }
  }
  *ortyp = local_c0;
  return uVar3;
}

Assistant:

static uint objgetap0(mcmcxdef *ctx, noreg objnum obj, prpnum prop,
                      objnum *orn, int inh, dattyp *ortyp)
{
    uchar  *sc;
    ushort  sccnt;
    ushort  psav;
    dattyp  typsav = DAT_NIL;
    objnum  osavn = MCMONINV;
    uchar  *o1;
    objnum  o1n;
    ushort  poff;
    int     found;
    uint    retval;
    dattyp  typ;
    uchar   sclist[100];                           /* up to 50 superclasses */
    objdef *objptr;
    
    NOREG((&obj))
    
    /* see if the property is in the current object first */
    if (!inh && (retval = objgetp(ctx, obj, prop, &typ)) != 0)
    {
        /* 
         *   tell the caller which object this came from, if the caller
         *   wants to know 
         */
        if (orn != 0)
            *orn = obj;

        /* if the caller wants to know the type, return it */
        if (ortyp != 0)
            *ortyp = typ;

        /* return the property offset */
        return retval;
    }
    
    /* lock the object, cache its superclass list, and unlock it */
    objptr = (objdef *)mcmlck(ctx, (mcmon)obj);
    sccnt = objnsc(objptr);
    memcpy(sclist, objsc(objptr), (size_t)(sccnt << 1));
    sc = sclist;
    mcmunlck(ctx, (mcmon)obj);
    
    /* try to inherit the property */
    for (found = FALSE ; sccnt != 0 ; sc += 2, --sccnt)
    {
        /* recursively look up the property in this superclass */
        poff = objgetap0(ctx, (objnum)osrp2(sc), prop, &o1n, FALSE, &typ);

        /* if we found the property, remember it */
        if (poff != 0)
        {
            int isdesc;
            
            /* if we have a previous object, determine lineage */
            if (found)
            {
                o1 = mcmlck(ctx, o1n);
                isdesc = objisd(ctx, o1, osavn);
                mcmunlck(ctx, o1n);
            }
            
            /*
             *   if we don't already have a property, or the new object
             *   is a descendant of the previously found object (meaning
             *   that the new object's property should override the
             *   previously found object's property), use this new
             *   property 
             */
            if (!found || isdesc)
            {
                psav = poff;
                osavn = o1n;
                typsav = typ;
                found = TRUE;
            }
        }
    }

    /* set return pointer and return the offset of what we found */
    if (orn != 0)
        *orn = osavn;

    /* return the object type if the caller wanted it */
    if (ortyp != 0)
        *ortyp = typsav;

    /* return the offset of the property if we found one, or zero if not */
    return (found ? psav : 0);
}